

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TableSetColumnWidth(int column_n,float width)

{
  float fVar1;
  ImGuiTable *table_00;
  ImGuiTableColumn *pIVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  ImGuiTableColumn *local_68;
  ImGuiTableColumn *local_60;
  float column_1_width_2;
  float column_1_width_1;
  float off;
  float column_1_width;
  ImGuiTableColumn *column_1;
  float max_width_0;
  float min_width;
  float column_0_width;
  ImGuiTableColumn *column_0;
  ImGuiTable *table;
  ImGuiContext *g;
  float width_local;
  int column_n_local;
  
  table_00 = GImGui->CurrentTable;
  bVar3 = false;
  if (table_00 != (ImGuiTable *)0x0) {
    bVar3 = (table_00->IsLayoutLocked & 1U) == 0;
  }
  if (!bVar3) {
    __assert_fail("table != __null && table->IsLayoutLocked == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                  ,0x25e7,"void ImGui::TableSetColumnWidth(int, float)");
  }
  bVar3 = false;
  if (-1 < column_n) {
    bVar3 = column_n < table_00->ColumnsCount;
  }
  if (bVar3) {
    pIVar2 = ImSpan<ImGuiTableColumn>::operator[](&table_00->Columns,column_n);
    fVar4 = TableGetMinColumnWidth();
    column_1._4_4_ = 3.4028235e+38;
    if ((table_00->Flags & 0x2000000U) == 0) {
      column_1._4_4_ =
           -(float)((int)table_00->ColumnsVisibleCount - (pIVar2->IndexWithinVisibleSet + 1)) *
           fVar4 + ((table_00->WorkRect).Max.x - pIVar2->MinX);
    }
    max_width_0 = ImClamp<float>(width,fVar4,column_1._4_4_);
    if (((pIVar2->WidthGiven != max_width_0) || (NAN(pIVar2->WidthGiven) || NAN(max_width_0))) &&
       ((pIVar2->WidthRequest != max_width_0 || (NAN(pIVar2->WidthRequest) || NAN(max_width_0))))) {
      if (pIVar2->NextVisibleColumn == -1) {
        local_60 = (ImGuiTableColumn *)0x0;
      }
      else {
        local_60 = ImSpan<ImGuiTableColumn>::operator[]
                             (&table_00->Columns,(int)pIVar2->NextVisibleColumn);
      }
      _off = local_60;
      table_00->IsSettingsDirty = true;
      if ((pIVar2->Flags & 8U) == 0) {
        if ((pIVar2->Flags & 4U) != 0) {
          if (local_60 == (ImGuiTableColumn *)0x0) {
            if (pIVar2->PrevVisibleColumn == -1) {
              local_68 = (ImGuiTableColumn *)0x0;
            }
            else {
              local_68 = ImSpan<ImGuiTableColumn>::operator[]
                                   (&table_00->Columns,(int)pIVar2->PrevVisibleColumn);
            }
            _off = local_68;
          }
          if (_off != (ImGuiTableColumn *)0x0) {
            if ((_off->Flags & 8U) == 0) {
              fVar5 = ImMax<float>(_off->WidthRequest - (max_width_0 - pIVar2->WidthRequest),fVar4);
              fVar4 = pIVar2->WidthRequest;
              fVar1 = _off->WidthRequest;
              _off->WidthRequest = fVar5;
              pIVar2->WidthRequest = (fVar4 + fVar1) - fVar5;
              TableUpdateColumnsWeightFromWidth(table_00);
            }
            else {
              fVar4 = ImMax<float>(fVar4,_off->WidthGiven + (pIVar2->WidthGiven - max_width_0));
              _off->WidthRequest = fVar4;
            }
          }
        }
      }
      else {
        if ((((local_60 != (ImGuiTableColumn *)0x0) && ((local_60->Flags & 8U) != 0)) &&
            (table_00->LeftMostStretchedColumnDisplayOrder != -1)) &&
           (table_00->LeftMostStretchedColumnDisplayOrder < pIVar2->DisplayOrder)) {
          fVar4 = ImMax<float>(local_60->WidthRequest - (max_width_0 - pIVar2->WidthRequest),fVar4);
          max_width_0 = (pIVar2->WidthRequest + local_60->WidthRequest) - fVar4;
          local_60->WidthRequest = fVar4;
        }
        pIVar2->WidthRequest = max_width_0;
      }
    }
    return;
  }
  __assert_fail("column_n >= 0 && column_n < table->ColumnsCount",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                ,0x25e8,"void ImGui::TableSetColumnWidth(int, float)");
}

Assistant:

void ImGui::TableSetColumnWidth(int column_n, float width)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && table->IsLayoutLocked == false);
    IM_ASSERT(column_n >= 0 && column_n < table->ColumnsCount);
    ImGuiTableColumn* column_0 = &table->Columns[column_n];
    float column_0_width = width;

    // Constraints
    const float min_width = TableGetMinColumnWidth();
    float max_width_0 = FLT_MAX;
    if (!(table->Flags & ImGuiTableFlags_ScrollX))
        max_width_0 = (table->WorkRect.Max.x - column_0->MinX) - (table->ColumnsVisibleCount - (column_0->IndexWithinVisibleSet + 1)) * min_width;
    column_0_width = ImClamp(column_0_width, min_width, max_width_0);

    // Compare both requested and actual given width to avoid overwriting requested width when column is stuck (minimum size, bounded)
    if (column_0->WidthGiven == column_0_width || column_0->WidthRequest == column_0_width)
        return;

    ImGuiTableColumn* column_1 = (column_0->NextVisibleColumn != -1) ? &table->Columns[column_0->NextVisibleColumn] : NULL;

    // In this surprisingly not simple because of how we support mixing Fixed and Stretch columns.
    // When forwarding resize from Wn| to Fn+1| we need to be considerate of the _NoResize flag on Fn+1.
    // FIXME-TABLE: Find a way to rewrite all of this so interactions feel more consistent for the user.
    // Scenarios:
    // - F1 F2 F3  resize from F1| or F2|   --> ok: alter ->WidthRequested of Fixed column. Subsequent columns will be offset.
    // - F1 F2 F3  resize from F3|          --> ok: alter ->WidthRequested of Fixed column. If active, ScrollX extent can be altered.
    // - F1 F2 W3  resize from F1| or F2|   --> ok: alter ->WidthRequested of Fixed column. If active, ScrollX extent can be altered, but it doesn't make much sense as the Stretch column will always be minimal size.
    // - F1 F2 W3  resize from W3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 W2 W3  resize from W1| or W2|   --> FIXME
    // - W1 W2 W3  resize from W3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 F2 F3  resize from F3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 F2     resize from F2|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 W2 F3  resize from W1| or W2|   --> ok
    // - W1 F2 W3  resize from W1| or F2|   --> FIXME
    // - F1 W2 F3  resize from W2|          --> ok
    // - W1 F2 F3  resize from W1|          --> ok: equivalent to resizing |F2. F3 will not move. (forwarded by Resize Rule 2)
    // - W1 F2 F3  resize from F2|          --> FIXME should resize F2, F3 and not have effect on W1 (Stretch columns are _before_ the Fixed column).

    // Rules:
    // - [Resize Rule 1] Can't resize from right of right-most visible column if there is any Stretch column. Implemented in TableUpdateLayout().
    // - [Resize Rule 2] Resizing from right-side of a Stretch column before a fixed column forward sizing to left-side of fixed column.
    // - [Resize Rule 3] If we are are followed by a fixed column and we have a Stretch column before, we need to ensure that our left border won't move.
    table->IsSettingsDirty = true;
    if (column_0->Flags & ImGuiTableColumnFlags_WidthFixed)
    {
        // [Resize Rule 3] If we are are followed by a fixed column and we have a Stretch column before, we need to ensure
        // that our left border won't move, which we can do by making sure column_a/column_b resizes cancels each others.
        if (column_1 && (column_1->Flags & ImGuiTableColumnFlags_WidthFixed))
            if (table->LeftMostStretchedColumnDisplayOrder != -1 && table->LeftMostStretchedColumnDisplayOrder < column_0->DisplayOrder)
            {
                // (old_a + old_b == new_a + new_b) --> (new_a == old_a + old_b - new_b)
                float column_1_width = ImMax(column_1->WidthRequest - (column_0_width - column_0->WidthRequest), min_width);
                column_0_width = column_0->WidthRequest + column_1->WidthRequest - column_1_width;
                column_1->WidthRequest = column_1_width;
            }

        // Apply
        //IMGUI_DEBUG_LOG("TableSetColumnWidth(%d, %.1f->%.1f)\n", column_0_idx, column_0->WidthRequested, column_0_width);
        column_0->WidthRequest = column_0_width;
    }
    else if (column_0->Flags & ImGuiTableColumnFlags_WidthStretch)
    {
        // We can also use previous column if there's no next one
        if (column_1 == NULL)
            column_1 = (column_0->PrevVisibleColumn != -1) ? &table->Columns[column_0->PrevVisibleColumn] : NULL;
        if (column_1 == NULL)
            return;

        if (column_1->Flags & ImGuiTableColumnFlags_WidthFixed)
        {
            // [Resize Rule 2]
            float off = (column_0->WidthGiven - column_0_width);
            float column_1_width = column_1->WidthGiven + off;
            column_1->WidthRequest = ImMax(min_width, column_1_width);
        }
        else
        {
            // (old_a + old_b == new_a + new_b) --> (new_a == old_a + old_b - new_b)
            float column_1_width = ImMax(column_1->WidthRequest - (column_0_width - column_0->WidthRequest), min_width);
            column_0_width = column_0->WidthRequest + column_1->WidthRequest - column_1_width;
            column_1->WidthRequest = column_1_width;
            column_0->WidthRequest = column_0_width;
            TableUpdateColumnsWeightFromWidth(table);
        }
    }
}